

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall llbuild::ninja::Lexer::setIdentifierTokenKind(Lexer *this,Token *result)

{
  int *piVar1;
  uint uVar2;
  Kind KVar3;
  
  piVar1 = (int *)result->start;
  uVar2 = *(int *)&this->bufferPos - (int)piVar1;
  switch(uVar2) {
  case 4:
    if (*piVar1 == 0x656c7572) {
      KVar3 = KWRule;
    }
    else {
      if (*piVar1 != 0x6c6f6f70) break;
      KVar3 = KWPool;
    }
    uVar2 = 4;
    goto LAB_0014232c;
  case 5:
    if ((char)piVar1[1] == 'd' && *piVar1 == 0x6c697562) {
      uVar2 = 5;
      KVar3 = KWBuild;
      goto LAB_0014232c;
    }
    break;
  case 7:
    KVar3 = KWDefault;
    if (*(int *)((long)piVar1 + 3) != 0x746c7561 || *piVar1 != 0x61666564) {
      if (*(int *)((long)piVar1 + 3) != 0x6564756c || *piVar1 != 0x6c636e69) break;
      KVar3 = KWInclude;
    }
    uVar2 = 7;
    goto LAB_0014232c;
  case 8:
    if (*(int *)((long)piVar1 + 3) == 0x6a6e696e && *piVar1 == 0x6e627573) {
      uVar2 = 8;
      KVar3 = KWKindLast;
      goto LAB_0014232c;
    }
  }
  KVar3 = Identifier;
LAB_0014232c:
  result->tokenKind = KVar3;
  result->length = uVar2;
  return result;
}

Assistant:

Token& Lexer::setIdentifierTokenKind(Token& result) const {
  unsigned length = bufferPos - result.start;
  switch (length) {
  case 4:
    if (memcmp("rule", result.start, 4) == 0)
      return setTokenKind(result, Token::Kind::KWRule);
    if (memcmp("pool", result.start, 4) == 0)
      return setTokenKind(result, Token::Kind::KWPool);
    break;

  case 5:
    if (memcmp("build", result.start, 5) == 0)
      return setTokenKind(result, Token::Kind::KWBuild);
    break;

  case 7:
    if (memcmp("default", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWDefault);
    if (memcmp("include", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWInclude);
    break;

  case 8:
    if (memcmp("subninja", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWSubninja);
    break;
  }

  return setTokenKind(result, Token::Kind::Identifier);
}